

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void modify_account(int n)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode __a;
  int iVar3;
  long *plVar4;
  ostream *this;
  int pos;
  long local_240;
  fstream File;
  char local_230 [512];
  undefined1 local_30 [8];
  Account account;
  int found;
  int n_local;
  
  account.client_class = 0;
  account._26_2_ = 0;
  account._28_4_ = n;
  Account::Account((Account *)local_30);
  std::fstream::fstream(&local_240);
  __a = std::operator|(_S_bin,_S_in);
  std::operator|(__a,_S_out);
  std::fstream::open((char *)&local_240,0x107145);
  bVar1 = std::ios::operator!((ios *)((long)&local_240 + *(long *)(local_240 + -0x18)));
  if ((bVar1 & 1) == 0) {
    while( true ) {
      plVar4 = (long *)std::istream::read((char *)&local_240,(long)local_30);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if (!bVar2 || account._24_4_ != 0) break;
      iVar3 = Account::return_account_num((Account *)local_30);
      if (iVar3 == account._28_4_) {
        Account::show_account((Account *)local_30);
        this = std::operator<<((ostream *)&std::cout,"\n\n==>>Enter The New Details of Account");
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        Account::modify_account((Account *)local_30);
        std::ostream::seekp((long)local_230,0xffffffe0);
        std::ostream::write(local_230,(long)local_30);
        std::operator<<((ostream *)&std::cout,
                        "\n\n\n\n\n\n\n\n\n\n\n\n\n\n\n                   \t\t\t\t\t      Record Updated..\n\n     \t\t\t\t\t                     ==>>Press Enter<<=="
                       );
        account.client_class = 1;
        account._26_2_ = 0;
      }
    }
    std::fstream::close();
    if (account._24_4_ == 0) {
      std::operator<<((ostream *)&std::cout,"\n\n Record Not Found ");
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"File could not be open !! Press any Key...");
  }
  std::fstream::~fstream(&local_240);
  return;
}

Assistant:

void modify_account(int n)
{
    /*!
     * It modifies account with account number (n) regarding to the values entered
     * by the user
     */
    int found=0;
    Account account;
    std::fstream File;
    File.open("Account.dat",std::ios::binary|std::ios::in|std::ios::out);
    if(!File)
    {
        std::cout<<"File could not be open !! Press any Key...";
        return;
    }
    while(File.read((char *) &account, sizeof(Account)) && found==0)
    {
        if(account.return_account_num()==n)
        {
            account.show_account();
            std::cout<<"\n\n==>>Enter The New Details of Account"<<std::endl;
            account.modify_account();
            int pos=(-1)*sizeof(Account);
            File.seekp(pos,std::ios::cur);
            File.write((char *) &account, sizeof(Account));
            std::cout<<"\n\n\n\n\n\n\n\n\n\n\n\n\n\n\n                   \t\t\t\t\t      Record Updated..\n\n     \t\t\t\t\t                     ==>>Press Enter<<==";
            found=1;
        }
    }
    File.close();
    if(found==0)
        std::cout<<"\n\n Record Not Found ";
}